

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  long in_RDI;
  bool in_stack_000000a3;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  undefined4 in_stack_000000b0;
  FieldAccessorType in_stack_000000b4;
  FieldDescriptor *in_stack_000000b8;
  Printer *in_stack_000000c0;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x5b5ece);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(
      variables_,
      "$deprecation$java.util.List<$type$> get$capitalized_name$List();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(variables_,
                 "$deprecation$$type$ get$capitalized_name$(int index);\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "$deprecation$java.util.List<java.lang.Integer>\n"
                   "get$capitalized_name$ValueList();\n");
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "$deprecation$int get$capitalized_name$Value(int index);\n");
  }
}